

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

AdaptorSignature *
cfd::core::AdaptorSignature::Encrypt
          (AdaptorSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          Pubkey *encryption_key)

{
  pointer ctx_00;
  int iVar1;
  uchar *adaptor_sig162;
  uchar *seckey32;
  uchar *msg32;
  CfdException *this;
  ByteData local_140;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  ByteData local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  ByteData local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  int local_a0;
  undefined1 local_9c [4];
  int ret;
  secp256k1_pubkey adaptor_key;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_sig_raw;
  secp256k1_context_struct *ctx;
  Pubkey *encryption_key_local;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  adaptor_sig_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator(&local_49);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0xa2,&local_49);
  ::std::allocator<unsigned_char>::~allocator(&local_49);
  ParsePubkey((secp256k1_pubkey *)local_9c,encryption_key);
  ctx_00 = adaptor_sig_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  adaptor_sig162 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  Privkey::GetData(&local_d0,sk);
  ByteData::GetBytes(&local_b8,&local_d0);
  seckey32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  ByteData256::GetData(&local_100,msg);
  ByteData::GetBytes(&local_e8,&local_100);
  msg32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
  iVar1 = secp256k1_ecdsa_adaptor_encrypt
                    ((secp256k1_context *)ctx_00,adaptor_sig162,seckey32,
                     (secp256k1_pubkey *)local_9c,msg32,
                     (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0,(void *)0x0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
  ByteData::~ByteData(&local_100);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  ByteData::~ByteData(&local_d0);
  local_a0 = iVar1;
  if (iVar1 != 1) {
    local_122 = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_120,"Could not create adaptor signature.",&local_121);
    CfdException::CfdException(this,kCfdInternalError,&local_120);
    local_122 = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_140,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  AdaptorSignature(__return_storage_ptr__,&local_140);
  ByteData::~ByteData(&local_140);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

AdaptorSignature AdaptorSignature::Encrypt(
    const ByteData256 &msg, const Privkey &sk, const Pubkey &encryption_key) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> adaptor_sig_raw(
      AdaptorSignature::kAdaptorSignatureSize);
  auto adaptor_key = ParsePubkey(encryption_key);
  auto ret = secp256k1_ecdsa_adaptor_encrypt(
      ctx, adaptor_sig_raw.data(), sk.GetData().GetBytes().data(),
      &adaptor_key, msg.GetData().GetBytes().data(), nullptr, nullptr);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create adaptor signature.");
  }

  return AdaptorSignature(adaptor_sig_raw);
}